

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

bool __thiscall
testing::internal::
CartesianProductGenerator<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::AtEnd
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintCase>::operator==
                    (&(this->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintCase>,_testing::internal::ParamIterator<int>_>
                      .
                      super__Head_base<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintCase>,_false>
                      ._M_head_impl,
                     &(this->end_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintCase>,_testing::internal::ParamIterator<int>_>
                      .
                      super__Head_base<0UL,_testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintCase>,_false>
                      ._M_head_impl);
  if (bVar1) {
    return true;
  }
  bVar1 = ParamIterator<int>::operator==
                    ((ParamIterator<int> *)&this->current_,(ParamIterator<int> *)&this->end_);
  return bVar1;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }